

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::MockCodeGenerator::GetOutputFileContent_abi_cxx11_
          (string *__return_storage_ptr__,MockCodeGenerator *this,string_view generator_name,
          string_view parameter,string_view file,string_view parsed_file_list,
          string_view first_message_name)

{
  string_view format;
  Arg *in_stack_fffffffffffffef8;
  Arg local_100;
  Arg local_d0;
  Arg local_a0;
  Arg local_70;
  MockCodeGenerator *local_40;
  size_t local_38;
  
  local_70.piece_._M_str = (char *)parameter._M_len;
  local_70.piece_._M_len = (size_t)generator_name._M_str;
  local_38 = generator_name._M_len;
  local_a0.piece_._M_len = file._M_len;
  local_a0.piece_._M_str = file._M_str;
  local_d0.piece_._M_len = first_message_name._M_len;
  local_d0.piece_._M_str = first_message_name._M_str;
  local_100.piece_._M_len = parsed_file_list._M_len;
  local_100.piece_._M_str = parsed_file_list._M_str;
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"$0: $1, $2, $3, $4\n";
  local_40 = this;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&DAT_00000013,format,&local_70,&local_a0,
             &local_d0,&local_100,in_stack_fffffffffffffef8);
  return __return_storage_ptr__;
}

Assistant:

std::string MockCodeGenerator::GetOutputFileContent(
    absl::string_view generator_name, absl::string_view parameter,
    absl::string_view file, absl::string_view parsed_file_list,
    absl::string_view first_message_name) {
  return absl::Substitute("$0: $1, $2, $3, $4\n", generator_name, parameter,
                          file, first_message_name, parsed_file_list);
}